

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void setLikeOptFlag(sqlite3 *db,char *zName,u8 flagVal)

{
  FuncDef *pFVar1;
  
  pFVar1 = sqlite3FindFunction(db,zName,2,'\x01','\0');
  if (pFVar1 != (FuncDef *)0x0) {
    pFVar1->funcFlags = pFVar1->funcFlags | (uint)flagVal;
  }
  pFVar1 = sqlite3FindFunction(db,zName,3,'\x01','\0');
  if (pFVar1 != (FuncDef *)0x0) {
    pFVar1->funcFlags = pFVar1->funcFlags | (uint)flagVal;
  }
  return;
}

Assistant:

static void setLikeOptFlag(sqlite3 *db, const char *zName, u8 flagVal){
  FuncDef *pDef;
  pDef = sqlite3FindFunction(db, zName, 2, SQLITE_UTF8, 0);
  if( ALWAYS(pDef) ){
    pDef->funcFlags |= flagVal;
  }
  pDef = sqlite3FindFunction(db, zName, 3, SQLITE_UTF8, 0);
  if( pDef ){
    pDef->funcFlags |= flagVal;
  }
}